

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# latex.hpp
# Opt level: O0

string * __thiscall
viennamath::rt_latex_translator<viennamath::rt_expression_interface<double>>::
process_impl_abi_cxx11_
          (string *__return_storage_ptr__,
          rt_latex_translator<viennamath::rt_expression_interface<double>> *this,
          rt_expression_interface<double> *ptr,bool use_parenthesis)

{
  bool bVar1;
  reference pprVar2;
  long lVar3;
  ostream *this_00;
  void *this_01;
  allocator<char> local_89;
  undefined4 local_88;
  string local_78 [32];
  __normal_iterator<viennamath::rt_latex_processor_interface<viennamath::rt_expression_interface<double>_>_*const_*,_std::vector<viennamath::rt_latex_processor_interface<viennamath::rt_expression_interface<double>_>_*,_std::allocator<viennamath::rt_latex_processor_interface<viennamath::rt_expression_interface<double>_>_*>_>_>
  local_58;
  __normal_iterator<viennamath::rt_latex_processor_interface<viennamath::rt_expression_interface<double>_>_*const_*,_std::vector<viennamath::rt_latex_processor_interface<viennamath::rt_expression_interface<double>_>_*,_std::allocator<viennamath::rt_latex_processor_interface<viennamath::rt_expression_interface<double>_>_*>_>_>
  local_50;
  const_iterator it;
  string ret;
  bool use_parenthesis_local;
  rt_expression_interface<double> *ptr_local;
  rt_latex_translator<viennamath::rt_expression_interface<double>_> *this_local;
  
  std::__cxx11::string::string((string *)&it);
  local_50._M_current =
       (rt_latex_processor_interface<viennamath::rt_expression_interface<double>_> **)
       std::
       vector<viennamath::rt_latex_processor_interface<viennamath::rt_expression_interface<double>_>_*,_std::allocator<viennamath::rt_latex_processor_interface<viennamath::rt_expression_interface<double>_>_*>_>
       ::begin((vector<viennamath::rt_latex_processor_interface<viennamath::rt_expression_interface<double>_>_*,_std::allocator<viennamath::rt_latex_processor_interface<viennamath::rt_expression_interface<double>_>_*>_>
                *)this);
  do {
    local_58._M_current =
         (rt_latex_processor_interface<viennamath::rt_expression_interface<double>_> **)
         std::
         vector<viennamath::rt_latex_processor_interface<viennamath::rt_expression_interface<double>_>_*,_std::allocator<viennamath::rt_latex_processor_interface<viennamath::rt_expression_interface<double>_>_*>_>
         ::end((vector<viennamath::rt_latex_processor_interface<viennamath::rt_expression_interface<double>_>_*,_std::allocator<viennamath::rt_latex_processor_interface<viennamath::rt_expression_interface<double>_>_*>_>
                *)this);
    bVar1 = __gnu_cxx::operator!=(&local_50,&local_58);
    if (!bVar1) {
      this_00 = std::operator<<((ostream *)&std::cerr,
                                "ViennaMath: Warning: Unknown type in latex translator: ");
      this_01 = (void *)std::ostream::operator<<(this_00,ptr);
      std::ostream::operator<<(this_01,std::endl<char,std::char_traits<char>>);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)__return_storage_ptr__," \\chi_{\\mathrm{unknown}} ",&local_89);
      std::allocator<char>::~allocator(&local_89);
LAB_00135e00:
      local_88 = 1;
      std::__cxx11::string::~string((string *)&it);
      return __return_storage_ptr__;
    }
    pprVar2 = __gnu_cxx::
              __normal_iterator<viennamath::rt_latex_processor_interface<viennamath::rt_expression_interface<double>_>_*const_*,_std::vector<viennamath::rt_latex_processor_interface<viennamath::rt_expression_interface<double>_>_*,_std::allocator<viennamath::rt_latex_processor_interface<viennamath::rt_expression_interface<double>_>_*>_>_>
              ::operator*(&local_50);
    (*(*pprVar2)->_vptr_rt_latex_processor_interface[1])
              (local_78,*pprVar2,ptr,(ulong)(use_parenthesis & 1),this);
    std::__cxx11::string::operator=((string *)&it,local_78);
    std::__cxx11::string::~string(local_78);
    lVar3 = std::__cxx11::string::size();
    if (lVar3 != 0) {
      std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)&it);
      goto LAB_00135e00;
    }
    __gnu_cxx::
    __normal_iterator<viennamath::rt_latex_processor_interface<viennamath::rt_expression_interface<double>_>_*const_*,_std::vector<viennamath::rt_latex_processor_interface<viennamath::rt_expression_interface<double>_>_*,_std::allocator<viennamath::rt_latex_processor_interface<viennamath::rt_expression_interface<double>_>_*>_>_>
    ::operator++(&local_50);
  } while( true );
}

Assistant:

std::string process_impl(InterfaceType const * ptr,
                               bool use_parenthesis = false) const
      {
        std::string ret;

        for (typename ProcessorArray::const_iterator it = processors_.begin();
                                                     it != processors_.end();
                                                   ++it)
        {
          ret = (*it)->process(ptr, use_parenthesis, *this);
          if (ret.size() > 0)
            return ret;
        }

        std::cerr << "ViennaMath: Warning: Unknown type in latex translator: " << ptr << std::endl;
        //throw "Unknown type!";
        return " \\chi_{\\mathrm{unknown}} ";
      }